

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Builder *params;
  Builder *extraout_RDX;
  Builder *params_00;
  Builder *extraout_RDX_00;
  Builder local_580;
  String local_558;
  bool local_539;
  undefined1 local_538 [7];
  bool _kj_shouldLog_4;
  String local_510;
  char (*local_4f8) [31];
  undefined1 local_4f0 [8];
  DebugComparison<const_char_(&)[31],_kj::String> _kjCondition_4;
  String local_490;
  bool local_471;
  undefined1 local_470 [7];
  bool _kj_shouldLog_3;
  String local_448;
  char (*local_430) [16];
  undefined1 local_428 [8];
  DebugComparison<const_char_(&)[16],_kj::String> _kjCondition_3;
  String local_3c8;
  bool local_3a9;
  undefined1 local_3a8 [7];
  bool _kj_shouldLog_2;
  String local_380;
  char (*local_368) [17];
  undefined1 local_360 [8];
  DebugComparison<const_char_(&)[17],_kj::String> _kjCondition_2;
  String local_300;
  bool local_2e1;
  undefined1 local_2e0 [7];
  bool _kj_shouldLog_1;
  String local_2b8;
  char (*local_2a0) [16];
  undefined1 local_298 [8];
  DebugComparison<const_char_(&)[16],_kj::String> _kjCondition_1;
  bool local_241;
  undefined1 local_240 [7];
  bool _kj_shouldLog;
  char (*local_228) [230];
  undefined1 local_220 [8];
  DebugComparison<const_char_(&)[230],_kj::String> _kjCondition;
  Builder local_1c0;
  ArrayPtr<const_char> local_198;
  Builder local_188;
  Builder local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase581 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion0(&local_160,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union0::Builder::setU0f0s16(&local_160,0x7b);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion1(&local_188,(Builder *)local_128);
  Text::Reader::Reader((Reader *)&local_198,"foo");
  capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f0sp(&local_188,(Reader)local_198);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion2(&local_1c0,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union2::Builder::setU2f0s1(&local_1c0,true);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion3
            ((Builder *)&_kjCondition.result,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union3::Builder::setU3f0s64
            ((Builder *)&_kjCondition.result,0x1b69b4ba630f34e);
  local_228 = (char (*) [230])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [230])
                         "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                        );
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
            ((String *)local_240,(kj *)local_128,params);
  kj::_::DebugExpression<char_const(&)[230]>::operator==
            ((DebugComparison<const_char_(&)[230],_kj::String> *)local_220,
             (DebugExpression<char_const(&)[230]> *)&local_228,(String *)local_240);
  kj::String::~String((String *)local_240);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_220);
  if (!bVar1) {
    local_241 = kj::_::Debug::shouldLog(ERROR);
    params_00 = extraout_RDX;
    while (local_241 != false) {
      kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
                ((String *)&_kjCondition_1.result,(kj *)local_128,params_00);
      kj::_::Debug::
      log<char_const(&)[290],kj::_::DebugComparison<char_const(&)[230],kj::String>&,char_const(&)[230],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x255,ERROR,
                 "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", _kjCondition, \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
                 ,(char (*) [290])
                  "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
                 ,(DebugComparison<const_char_(&)[230],_kj::String> *)local_220,
                 (char (*) [230])
                 "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                 ,(String *)&_kjCondition_1.result);
      kj::String::~String((String *)&_kjCondition_1.result);
      params_00 = extraout_RDX_00;
      local_241 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[230],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[230],_kj::String> *)local_220);
  local_2a0 = (char (*) [16])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [16])"(u0f0s16 = 123)");
  capnproto_test::capnp::test::TestUnion::Builder::getUnion0
            ((Builder *)local_2e0,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_2b8,(Builder *)local_2e0);
  kj::_::DebugExpression<char_const(&)[16]>::operator==
            ((DebugComparison<const_char_(&)[16],_kj::String> *)local_298,
             (DebugExpression<char_const(&)[16]> *)&local_2a0,&local_2b8);
  kj::String::~String(&local_2b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_298);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion0
                ((Builder *)&_kjCondition_2.result,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
                (&local_300,(Builder *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[16],kj::String>&,char_const(&)[16],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,599,ERROR,
                 "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", _kjCondition, \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
                 ,(char (*) [68])
                  "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
                 (DebugComparison<const_char_(&)[16],_kj::String> *)local_298,
                 (char (*) [16])"(u0f0s16 = 123)",&local_300);
      kj::String::~String(&local_300);
      local_2e1 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[16],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[16],_kj::String> *)local_298);
  local_368 = (char (*) [17])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [17])"(u1f0sp = \"foo\")");
  capnproto_test::capnp::test::TestUnion::Builder::getUnion1
            ((Builder *)local_3a8,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>(&local_380,(Builder *)local_3a8);
  kj::_::DebugExpression<char_const(&)[17]>::operator==
            ((DebugComparison<const_char_(&)[17],_kj::String> *)local_360,
             (DebugExpression<char_const(&)[17]> *)&local_368,&local_380);
  kj::String::~String(&local_380);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (!bVar1) {
    local_3a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a9 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion1
                ((Builder *)&_kjCondition_3.result,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
                (&local_3c8,(Builder *)&_kjCondition_3.result);
      kj::_::Debug::
      log<char_const(&)[71],kj::_::DebugComparison<char_const(&)[17],kj::String>&,char_const(&)[17],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,600,ERROR,
                 "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", _kjCondition, \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
                 ,(char (*) [71])
                  "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
                 (DebugComparison<const_char_(&)[17],_kj::String> *)local_360,
                 (char (*) [17])"(u1f0sp = \"foo\")",&local_3c8);
      kj::String::~String(&local_3c8);
      local_3a9 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[17],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[17],_kj::String> *)local_360);
  local_430 = (char (*) [16])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [16])"(u2f0s1 = true)");
  capnproto_test::capnp::test::TestUnion::Builder::getUnion2
            ((Builder *)local_470,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>(&local_448,(Builder *)local_470);
  kj::_::DebugExpression<char_const(&)[16]>::operator==
            ((DebugComparison<const_char_(&)[16],_kj::String> *)local_428,
             (DebugExpression<char_const(&)[16]> *)&local_430,&local_448);
  kj::String::~String(&local_448);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_428);
  if (!bVar1) {
    local_471 = kj::_::Debug::shouldLog(ERROR);
    while (local_471 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion2
                ((Builder *)&_kjCondition_4.result,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
                (&local_490,(Builder *)&_kjCondition_4.result);
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[16],kj::String>&,char_const(&)[16],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x259,ERROR,
                 "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", _kjCondition, \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
                 ,(char (*) [68])
                  "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
                 (DebugComparison<const_char_(&)[16],_kj::String> *)local_428,
                 (char (*) [16])"(u2f0s1 = true)",&local_490);
      kj::String::~String(&local_490);
      local_471 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[16],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[16],_kj::String> *)local_428);
  local_4f8 = (char (*) [31])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [31])"(u3f0s64 = 123456789012345678)");
  capnproto_test::capnp::test::TestUnion::Builder::getUnion3
            ((Builder *)local_538,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>(&local_510,(Builder *)local_538);
  kj::_::DebugExpression<char_const(&)[31]>::operator==
            ((DebugComparison<const_char_(&)[31],_kj::String> *)local_4f0,
             (DebugExpression<char_const(&)[31]> *)&local_4f8,&local_510);
  kj::String::~String(&local_510);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f0);
  if (!bVar1) {
    local_539 = kj::_::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion3(&local_580,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>(&local_558,&local_580);
      kj::_::Debug::
      log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[31],kj::String>&,char_const(&)[31],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x25a,ERROR,
                 "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", _kjCondition, \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
                 ,(char (*) [83])
                  "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
                 ,(DebugComparison<const_char_(&)[31],_kj::String> *)local_4f0,
                 (char (*) [31])"(u3f0s64 = 123456789012345678)",&local_558);
      kj::String::~String(&local_558);
      local_539 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[31],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[31],_kj::String> *)local_4f0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}